

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O2

HistoryEntry * __thiscall
QTextBrowserPrivate::history(HistoryEntry *__return_storage_ptr__,QTextBrowserPrivate *this,int i)

{
  ulong uVar1;
  HistoryEntry *pHVar2;
  
  if (i < 1) {
    uVar1 = (this->stack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.size;
    if (uVar1 <= (uint)-i) goto LAB_00467d77;
    pHVar2 = (this->stack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.ptr +
             uVar1 + (long)i + -1;
  }
  else {
    uVar1 = (this->forwardStack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.size;
    if (uVar1 < (uint)i) {
LAB_00467d77:
      HistoryEntry::HistoryEntry(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    pHVar2 = (this->forwardStack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.ptr +
             (uVar1 - (uint)i);
  }
  HistoryEntry::HistoryEntry(__return_storage_ptr__,pHVar2);
  return __return_storage_ptr__;
}

Assistant:

HistoryEntry history(int i) const
    {
        if (i <= 0)
            if (-i < stack.size())
                return stack[stack.size()+i-1];
            else
                return HistoryEntry();
        else
            if (i <= forwardStack.size())
                return forwardStack[forwardStack.size()-i];
            else
                return HistoryEntry();
    }